

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

QString * QUtf32::convertToUnicode
                    (QString *__return_storage_ptr__,QByteArrayView in,State *state,
                    DataEndianness endian)

{
  Data *pDVar1;
  QChar *pQVar2;
  char16_t *pcVar3;
  DataEndianness in_R9D;
  QByteArrayView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::resize(__return_storage_ptr__,(long)((long)&((QChar *)in.m_size)[3].ucs + 1) >> 1);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  in_00.m_data = (storage_type *)state;
  pQVar2 = convertToUnicode((QUtf32 *)(__return_storage_ptr__->d).ptr,(QChar *)in.m_size,in_00,
                            (State *)(ulong)endian,in_R9D);
  pcVar3 = (__return_storage_ptr__->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = &QString::_empty;
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)pQVar2 - (long)pcVar3 >> 1),__length);
  return __return_storage_ptr__;
}

Assistant:

QString QUtf32::convertToUnicode(QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    QString result;
    result.resize((in.size() + 7) >> 1); // worst case
    QChar *end = convertToUnicode(result.data(), in, state, endian);
    result.truncate(end - result.constData());
    return result;
}